

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)18>_> * __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::buildPipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,
          SimpleGraphicsPipelineBuilder *this,UVec2 *renderSize,VkRenderPass renderPass)

{
  uint uVar1;
  DeviceInterface *vk;
  VkDevice device;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkRect2D scissor;
  VkPipelineRasterizationStateCreateInfo rasterStateParams;
  VkPipelineTessellationStateCreateInfo tessStateCreateInfo;
  VkViewport local_280;
  VkPipelineColorBlendAttachmentState colorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkPipelineDepthStencilStateCreateInfo depthStencilStateParams;
  VkPipelineMultisampleStateCreateInfo multisampleStateParams;
  VkPipelineViewportStateCreateInfo viewportStateParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkPipelineColorBlendStateCreateInfo local_100;
  VkGraphicsPipelineCreateInfo graphicsPipelineParams;
  
  vk = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  graphicsPipelineParams.pNext = (void *)0x0;
  graphicsPipelineParams.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)0x0;
  graphicsPipelineParams.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  graphicsPipelineParams.flags = 0;
  graphicsPipelineParams.stageCount = 0;
  graphicsPipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  graphicsPipelineParams.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  graphicsPipelineParams._4_4_ = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&rasterStateParams,vk,device,
             (VkPipelineLayoutCreateInfo *)&graphicsPipelineParams,(VkAllocationCallbacks *)0x0);
  depthStencilStateParams.flags = rasterStateParams.flags;
  depthStencilStateParams.depthTestEnable = rasterStateParams.depthClampEnable;
  depthStencilStateParams.depthWriteEnable = rasterStateParams.rasterizerDiscardEnable;
  depthStencilStateParams.depthCompareOp = rasterStateParams.polygonMode;
  depthStencilStateParams.sType = rasterStateParams.sType;
  depthStencilStateParams._4_4_ = rasterStateParams._4_4_;
  depthStencilStateParams.pNext = rasterStateParams.pNext;
  rasterStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  rasterStateParams._4_4_ = 0;
  rasterStateParams.pNext = (void *)0x0;
  rasterStateParams.flags = 0;
  rasterStateParams.depthClampEnable = 0;
  rasterStateParams.rasterizerDiscardEnable = 0;
  rasterStateParams.polygonMode = VK_POLYGON_MODE_FILL;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)CONCAT44(depthStencilStateParams.depthTestEnable,depthStencilStateParams.flags);
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         CONCAT44(depthStencilStateParams.depthCompareOp,depthStencilStateParams.depthWriteEnable);
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       depthStencilStateParams._0_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)depthStencilStateParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&rasterStateParams);
  vertexInputStateParams.pVertexBindingDescriptions = &vertexInputBindingDescription;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  vertexInputStateParams.pVertexAttributeDescriptions = vertexInputAttributeDescriptions;
  vertexInputAttributeDescriptions[1].location = 1;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  graphicsPipelineParams.pVertexInputState = &vertexInputStateParams;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateParams.pNext = (void *)0x0;
  vertexInputStateParams.flags = 0;
  vertexInputStateParams.vertexBindingDescriptionCount = 1;
  vertexInputStateParams.vertexAttributeDescriptionCount = 2;
  tessStateCreateInfo.patchControlPoints = this->m_patchControlPoints;
  uVar1 = 10;
  if (tessStateCreateInfo.patchControlPoints == 0) {
    uVar1 = 3;
  }
  graphicsPipelineParams.pInputAssemblyState = &inputAssemblyStateParams;
  inputAssemblyStateParams.pNext = (void *)0x0;
  inputAssemblyStateParams.primitiveRestartEnable = 0;
  inputAssemblyStateParams._28_4_ = 0;
  inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  inputAssemblyStateParams._4_4_ = 0;
  inputAssemblyStateParams._16_8_ = (ulong)uVar1 << 0x20;
  graphicsPipelineParams.pTessellationState = &tessStateCreateInfo;
  if (tessStateCreateInfo.patchControlPoints == 0) {
    graphicsPipelineParams.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  viewportStateParams.pViewports = &local_280;
  local_280.x = 0.0;
  local_280.y = 0.0;
  scissor.extent.width = renderSize->m_data[0];
  local_280.width = (float)scissor.extent.width;
  scissor.extent.height = renderSize->m_data[1];
  local_280.height = (float)scissor.extent.height;
  viewportStateParams.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  local_280.minDepth = 0.0;
  local_280.maxDepth = 1.0;
  graphicsPipelineParams.pViewportState = &viewportStateParams;
  viewportStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportStateParams.pNext = (void *)0x0;
  viewportStateParams.flags = 0;
  viewportStateParams.viewportCount = 1;
  viewportStateParams.scissorCount = 1;
  rasterStateParams.pNext = (void *)0x0;
  rasterStateParams.depthBiasClamp = 0.0;
  rasterStateParams.depthBiasSlopeFactor = 0.0;
  rasterStateParams.cullMode = 0;
  rasterStateParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterStateParams.depthBiasEnable = 0;
  rasterStateParams.depthBiasConstantFactor = 0.0;
  rasterStateParams.flags = 0;
  rasterStateParams.depthClampEnable = 0;
  rasterStateParams.rasterizerDiscardEnable = 0;
  rasterStateParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  rasterStateParams._4_4_ = 0;
  rasterStateParams.lineWidth = 1.0;
  rasterStateParams._60_4_ = 0;
  local_100.pAttachments = &colorBlendAttachmentState;
  colorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  colorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  colorBlendAttachmentState.alphaBlendOp = VK_BLEND_OP_ADD;
  colorBlendAttachmentState.colorWriteMask = 0xf;
  colorBlendAttachmentState.blendEnable = 0;
  colorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  colorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  colorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_ADD;
  graphicsPipelineParams.pColorBlendState = &local_100;
  local_100.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_100.pNext = (void *)0x0;
  local_100.flags = 0;
  local_100.logicOpEnable = 0;
  local_100.logicOp = VK_LOGIC_OP_COPY;
  local_100.attachmentCount = 1;
  local_100.blendConstants[0] = 0.0;
  local_100.blendConstants[1] = 0.0;
  local_100.blendConstants[2] = 0.0;
  local_100.blendConstants[3] = 0.0;
  graphicsPipelineParams.pMultisampleState = &multisampleStateParams;
  multisampleStateParams.pNext = (void *)0x0;
  multisampleStateParams.sampleShadingEnable = 0;
  multisampleStateParams.minSampleShading = 0.0;
  multisampleStateParams.pSampleMask = (VkSampleMask *)0x0;
  multisampleStateParams.alphaToCoverageEnable = 0;
  multisampleStateParams.alphaToOneEnable = 0;
  multisampleStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  multisampleStateParams._4_4_ = 0;
  multisampleStateParams.flags = 0;
  multisampleStateParams.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  depthStencilStateParams.pNext = (void *)0x0;
  depthStencilStateParams.flags = 0;
  depthStencilStateParams.depthBoundsTestEnable = 0;
  depthStencilStateParams.stencilTestEnable = 0;
  depthStencilStateParams.front.failOp = VK_STENCIL_OP_KEEP;
  depthStencilStateParams.front.passOp = VK_STENCIL_OP_KEEP;
  depthStencilStateParams.front.depthFailOp = VK_STENCIL_OP_KEEP;
  depthStencilStateParams.front.compareOp = VK_COMPARE_OP_NEVER;
  depthStencilStateParams.front.compareMask = 0;
  depthStencilStateParams.front.writeMask = 0;
  depthStencilStateParams.front.reference = 0;
  depthStencilStateParams.back.failOp = VK_STENCIL_OP_KEEP;
  depthStencilStateParams.back.passOp = VK_STENCIL_OP_KEEP;
  depthStencilStateParams.back.depthFailOp = VK_STENCIL_OP_KEEP;
  depthStencilStateParams.back.compareOp = VK_COMPARE_OP_NEVER;
  depthStencilStateParams.back.compareMask = 0;
  depthStencilStateParams.back.writeMask = 0;
  depthStencilStateParams.back.reference = 0;
  depthStencilStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  depthStencilStateParams._4_4_ = 0;
  depthStencilStateParams.depthTestEnable = 1;
  depthStencilStateParams.depthWriteEnable = 1;
  tessStateCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  tessStateCreateInfo.pNext = (void *)0x0;
  tessStateCreateInfo.flags = 0;
  graphicsPipelineParams.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  graphicsPipelineParams.pNext = (void *)0x0;
  depthStencilStateParams.depthCompareOp = VK_COMPARE_OP_LESS_OR_EQUAL;
  depthStencilStateParams.minDepthBounds = 0.0;
  depthStencilStateParams.maxDepthBounds = 1.0;
  graphicsPipelineParams._16_8_ = (ulong)this->m_shaderStageCount << 0x20;
  graphicsPipelineParams.pStages = this->m_shaderStageInfo;
  graphicsPipelineParams.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  graphicsPipelineParams.layout.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  graphicsPipelineParams.subpass = 0;
  graphicsPipelineParams.basePipelineHandle.m_internal = 0;
  graphicsPipelineParams.basePipelineIndex = 0;
  graphicsPipelineParams.pRasterizationState = &rasterStateParams;
  graphicsPipelineParams.pDepthStencilState = &depthStencilStateParams;
  graphicsPipelineParams.renderPass.m_internal = renderPass.m_internal;
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,device,(VkPipelineCache)0x0,&graphicsPipelineParams,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> SimpleGraphicsPipelineBuilder::buildPipeline(tcu::UVec2 renderSize, VkRenderPass renderPass)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();
	const VkDevice              vkDevice            = m_context.getDevice();

	// Create pipeline layout
	{
		const VkPipelineLayoutCreateInfo pipelineLayoutParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,      // VkStructureType                  sType;
			DE_NULL,                                            // const void*                      pNext;
			0u,                                                 // VkPipelineLayoutCreateFlags      flags;
			0u,                                                 // deUint32                         setLayoutCount;
			DE_NULL,                                            // const VkDescriptorSetLayout*     pSetLayouts;
			0u,                                                 // deUint32                         pushConstantRangeCount;
			DE_NULL                                             // const VkPushConstantRange*       pPushConstantRanges;
		};

		m_pipelineLayout = createPipelineLayout(vk, vkDevice, &pipelineLayoutParams);
	}

	// Create pipeline
	const VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0u,                                 // deUint32                 binding;
		sizeof(Vertex4RGBA),                // deUint32                 strideInBytes;
		VK_VERTEX_INPUT_RATE_VERTEX,        // VkVertexInputRate        inputRate;
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[2] =
	{
		{
			0u,                                 // deUint32 location;
			0u,                                 // deUint32 binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,      // VkFormat format;
			0u                                  // deUint32 offsetInBytes;
		},
		{
			1u,                                 // deUint32 location;
			0u,                                 // deUint32 binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,      // VkFormat format;
			DE_OFFSET_OF(Vertex4RGBA, color),   // deUint32 offsetInBytes;
		}
	};

	const VkPipelineVertexInputStateCreateInfo vertexInputStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,      // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineVertexInputStateCreateFlags    flags;
		1u,                                                             // deUint32                                 vertexBindingDescriptionCount;
		&vertexInputBindingDescription,                                 // const VkVertexInputBindingDescription*   pVertexBindingDescriptions;
		2u,                                                             // deUint32                                 vertexAttributeDescriptionCount;
		vertexInputAttributeDescriptions,                               // const VkVertexInputAttributeDescription* pVertexAttributeDescriptions;
	};

	VkPrimitiveTopology primitiveTopology = (m_patchControlPoints > 0) ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST : VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
	const VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,    // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineInputAssemblyStateCreateFlags  flags;
		primitiveTopology,                                              // VkPrimitiveTopology                      topology;
		VK_FALSE,                                                       // VkBool32                                 primitiveRestartEnable;
	};

	const VkViewport viewport =
	{
		0.0f,                       // float    originX;
		0.0f,                       // float    originY;
		(float)renderSize.x(),      // float    width;
		(float)renderSize.y(),      // float    height;
		0.0f,                       // float    minDepth;
		1.0f                        // float    maxDepth;
	};
	const VkRect2D scissor =
	{
		{ 0u, 0u },                                                     // VkOffset2D  offset;
		{ renderSize.x(), renderSize.y() }                              // VkExtent2D  extent;
	};
	const VkPipelineViewportStateCreateInfo viewportStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,          // VkStructureType                      sType;
		DE_NULL,                                                        // const void*                          pNext;
		0u,                                                             // VkPipelineViewportStateCreateFlags   flags;
		1u,                                                             // deUint32                             viewportCount;
		&viewport,                                                      // const VkViewport*                    pViewports;
		1u,                                                             // deUint32                             scissorCount;
		&scissor                                                        // const VkRect2D*                      pScissors;
	};

	const VkPipelineRasterizationStateCreateInfo rasterStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,     // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,                                                       // VkBool32                                 depthClampEnable;
		VK_FALSE,                                                       // VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,                                           // VkPolygonMode                            polygonMode;
		VK_CULL_MODE_NONE,                                              // VkCullModeFlags                          cullMode;
		VK_FRONT_FACE_COUNTER_CLOCKWISE,                                // VkFrontFace                              frontFace;
		VK_FALSE,                                                       // VkBool32                                 depthBiasEnable;
		0.0f,                                                           // float                                    depthBiasConstantFactor;
		0.0f,                                                           // float                                    depthBiasClamp;
		0.0f,                                                           // float                                    depthBiasSlopeFactor;
		1.0f,                                                           // float                                    lineWidth;
	};

	const VkPipelineColorBlendAttachmentState colorBlendAttachmentState =
	{
		VK_FALSE,                                                                   // VkBool32                 blendEnable;
		VK_BLEND_FACTOR_ONE,                                                        // VkBlendFactor            srcColorBlendFactor;
		VK_BLEND_FACTOR_ZERO,                                                       // VkBlendFactor            dstColorBlendFactor;
		VK_BLEND_OP_ADD,                                                            // VkBlendOp                colorBlendOp;
		VK_BLEND_FACTOR_ONE,                                                        // VkBlendFactor            srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ZERO,                                                       // VkBlendFactor            dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,                                                            // VkBlendOp                alphaBlendOp;
		VK_COLOR_COMPONENT_R_BIT |
		VK_COLOR_COMPONENT_G_BIT |
		VK_COLOR_COMPONENT_B_BIT |
		VK_COLOR_COMPONENT_A_BIT                                                    // VkColorComponentFlags    colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo colorBlendStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,   // VkStructureType                              sType;
		DE_NULL,                                                    // const void*                                  pNext;
		0u,                                                         // VkPipelineColorBlendStateCreateFlags         flags;
		VK_FALSE,                                                   // VkBool32                                     logicOpEnable;
		VK_LOGIC_OP_COPY,                                           // VkLogicOp                                    logicOp;
		1u,                                                         // deUint32                                     attachmentCount;
		&colorBlendAttachmentState,                                 // const VkPipelineColorBlendAttachmentState*   pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },                                 // float                                        blendConst[4];
	};

	const VkPipelineMultisampleStateCreateInfo  multisampleStateParams  =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,   // VkStructureType                          sType;
		DE_NULL,                                                    // const void*                              pNext;
		0u,                                                         // VkPipelineMultisampleStateCreateFlags    flags;
		VK_SAMPLE_COUNT_1_BIT,                                      // VkSampleCountFlagBits                    rasterizationSamples;
		VK_FALSE,                                                   // VkBool32                                 sampleShadingEnable;
		0.0f,                                                       // float                                    minSampleShading;
		DE_NULL,                                                    // const VkSampleMask*                      pSampleMask;
		VK_FALSE,                                                   // VkBool32                                 alphaToCoverageEnable;
		VK_FALSE,                                                   // VkBool32                                 alphaToOneEnable;
	};

	VkPipelineDepthStencilStateCreateInfo depthStencilStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO, // VkStructureType                          sType;
		DE_NULL,                                                    // const void*                              pNext;
		0u,                                                         // VkPipelineDepthStencilStateCreateFlags   flags;
		VK_TRUE,                                                    // VkBool32                                 depthTestEnable;
		VK_TRUE,                                                    // VkBool32                                 depthWriteEnable;
		VK_COMPARE_OP_LESS_OR_EQUAL,                                // VkCompareOp                              depthCompareOp;
		VK_FALSE,                                                   // VkBool32                                 depthBoundsTestEnable;
		VK_FALSE,                                                   // VkBool32                                 stencilTestEnable;
		// VkStencilOpState front;
		{
			VK_STENCIL_OP_KEEP,     // VkStencilOp  failOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  passOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  depthFailOp;
			VK_COMPARE_OP_NEVER,    // VkCompareOp  compareOp;
			0u,                     // deUint32     compareMask;
			0u,                     // deUint32     writeMask;
			0u,                     // deUint32     reference;
		},
		// VkStencilOpState back;
		{
			VK_STENCIL_OP_KEEP,     // VkStencilOp  failOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  passOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  depthFailOp;
			VK_COMPARE_OP_NEVER,    // VkCompareOp  compareOp;
			0u,                     // deUint32     compareMask;
			0u,                     // deUint32     writeMask;
			0u,                     // deUint32     reference;
		},
		0.0f,                                                      // float                                    minDepthBounds;
		1.0f,                                                      // float                                    maxDepthBounds;
	};

	const VkPipelineTessellationStateCreateInfo*	pTessCreateInfo		= DE_NULL;
	const VkPipelineTessellationStateCreateInfo		tessStateCreateInfo	=
	{
			VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,  // VkStructureType                          sType;
			DE_NULL,                                                    // const void*                              pNext;
			0u,                                                         // VkPipelineTessellationStateCreateFlags   flags;
			m_patchControlPoints,                                       // deUint32                                 patchControlPoints;
	};

	if (m_patchControlPoints > 0)
		pTessCreateInfo = &tessStateCreateInfo;

	const VkGraphicsPipelineCreateInfo graphicsPipelineParams =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,    // VkStructureType                                  sType;
		DE_NULL,                                            // const void*                                      pNext;
		0u,                                                 // VkPipelineCreateFlags                            flags;
		m_shaderStageCount,                                 // deUint32                                         stageCount;
		m_shaderStageInfo,                                  // const VkPipelineShaderStageCreateInfo*           pStages;
		&vertexInputStateParams,                            // const VkPipelineVertexInputStateCreateInfo*      pVertexInputState;
		&inputAssemblyStateParams,                          // const VkPipelineInputAssemblyStateCreateInfo*    pInputAssemblyState;
		pTessCreateInfo,                                    // const VkPipelineTessellationStateCreateInfo*     pTessellationState;
		&viewportStateParams,                               // const VkPipelineViewportStateCreateInfo*         pViewportState;
		&rasterStateParams,                                 // const VkPipelineRasterizationStateCreateInfo*    pRasterState;
		&multisampleStateParams,                            // const VkPipelineMultisampleStateCreateInfo*      pMultisampleState;
		&depthStencilStateParams,                           // const VkPipelineDepthStencilStateCreateInfo*     pDepthStencilState;
		&colorBlendStateParams,                             // const VkPipelineColorBlendStateCreateInfo*       pColorBlendState;
		(const VkPipelineDynamicStateCreateInfo*)DE_NULL,   // const VkPipelineDynamicStateCreateInfo*          pDynamicState;
		*m_pipelineLayout,                                  // VkPipelineLayout                                 layout;
		renderPass,                                         // VkRenderPass                                     renderPass;
		0u,                                                 // deUint32                                         subpass;
		0u,                                                 // VkPipeline                                       basePipelineHandle;
		0,                                                  // deInt32                                          basePipelineIndex;
	};

	return createGraphicsPipeline(vk, vkDevice, DE_NULL, &graphicsPipelineParams);
}